

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBooleanElementwiseLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint32 uVar1;
  bool bVar2;
  undefined1 local_40 [8];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  Result::Result(__return_storage_ptr__);
  uVar1 = layer->_oneof_case_[0];
  if ((int)uVar1 < 0x352) {
    if ((uVar1 == 0x348) || (uVar1 == 0x34d)) {
LAB_00539e0f:
      validateInputCount((Result *)local_40,layer,2,2);
      goto LAB_00539e3f;
    }
  }
  else {
    if (uVar1 == 0x357) goto LAB_00539e0f;
    if (uVar1 == 0x352) {
      validateInputCount((Result *)local_40,layer,1,1);
      goto LAB_00539e3f;
    }
  }
  validateInputCount((Result *)local_40,layer,1,2);
LAB_00539e3f:
  __return_storage_ptr__->m_type = local_40._0_4_;
  __return_storage_ptr__->m_reason = local_40._4_4_;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_message,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
  }
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount((Result *)local_40,layer,1,1);
    __return_storage_ptr__->m_type = local_40._0_4_;
    __return_storage_ptr__->m_reason = local_40._4_4_;
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->m_message,(string *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_p != &local_28) {
      operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBooleanElementwiseLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalNot) {
        r = validateInputCount(layer, 1, 1);
    } else if (layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalAnd ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalOr ||
               layer.layer_case() == CoreML::Specification::NeuralNetworkLayer::kLogicalXor) {
        r = validateInputCount(layer, 2, 2);
    } else {
        r = validateInputCount(layer, 1, 2);
    }
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    return r;
}